

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glesv2_gears.c
# Opt level: O0

void multiply(float *a,float *b)

{
  div_t dVar1;
  int local_68;
  int iStack_64;
  div_t d;
  int j;
  int i;
  float m [16];
  float *b_local;
  float *a_local;
  
  m._56_8_ = b;
  for (d.rem = 0; d.rem < 0x10; d.rem = d.rem + 1) {
    (&j)[d.rem] = 0;
    dVar1 = div(d.rem,4);
    for (d.quot = 0; d.quot < 4; d.quot = d.quot + 1) {
      iStack_64 = dVar1.rem;
      local_68 = dVar1.quot;
      (&j)[d.rem] = (int)(a[(long)iStack_64 + (long)(d.quot << 2)] *
                          *(float *)(m._56_8_ + (long)(local_68 << 2) * 4 + (long)d.quot * 4) +
                         (float)(&j)[d.rem]);
    }
  }
  memcpy(a,&j,0x40);
  return;
}

Assistant:

static void multiply(float *a, const float *b)
{
  float m[16];
  int i, j;
  div_t d;

  for (i = 0; i < 16; i++) {
    m[i] = 0;
    d = div(i, 4);
    for (j = 0; j < 4; j++)
      m[i] += (a + d.rem)[j * 4] * (b + d.quot * 4)[j];
  }

  memcpy(a, m, sizeof(m));
}